

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void coins_tests::WriteCoinsViewEntry(CCoinsView *view,CAmount value,char flags)

{
  bool bVar1;
  unit_test_log_t *this;
  SaltedOutpointHasher *in_RDI;
  long in_FS_OFFSET;
  size_t usage;
  CCoinsMap map;
  CoinsViewCacheCursor cursor;
  CCoinsMapMemoryResource resource;
  CoinsCachePair sentinel;
  PoolResource<144UL,_8UL> *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  PoolResource<144UL,_8UL> *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  CoinsViewCacheCursor *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  SaltedOutpointHasher *in_stack_fffffffffffffd38;
  const_string *file;
  char flags_00;
  undefined1 *value_00;
  CoinsCachePair *in_stack_fffffffffffffd60;
  CCoinsMap *in_stack_fffffffffffffd68;
  const_string local_278 [2];
  lazy_ostream local_258 [2];
  assertion_result local_238 [2];
  unit_test_log_t *local_200;
  undefined1 local_1f8 [16];
  undefined1 local_188 [32];
  undefined8 local_168;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  value_00 = local_78;
  std::pair<const_COutPoint,_CCoinsCacheEntry>::pair<const_COutPoint,_CCoinsCacheEntry,_true>
            ((pair<const_COutPoint,_CCoinsCacheEntry> *)in_stack_fffffffffffffd08);
  CCoinsCacheEntry::SelfRef
            ((CCoinsCacheEntry *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             (CoinsCachePair *)in_stack_fffffffffffffd08);
  PoolResource<144UL,_8UL>::PoolResource(in_stack_fffffffffffffd08);
  SaltedOutpointHasher::SaltedOutpointHasher
            (in_stack_fffffffffffffd38,(bool)in_stack_fffffffffffffd37);
  flags_00 = (char)((ulong)local_1f8 >> 0x38);
  PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>::PoolAllocator
            ((PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL> *)
             in_stack_fffffffffffffd08,(ResourceType *)0x50c3ca);
  std::
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  ::unordered_map((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                   *)in_stack_fffffffffffffd28,
                  CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                  (hasher *)in_stack_fffffffffffffd18,
                  (key_equal *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                  (allocator_type *)in_stack_fffffffffffffd08);
  this = (unit_test_log_t *)
         InsertCoinsMapEntry(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,(CAmount)value_00,
                             flags_00);
  local_200 = this;
  CoinsViewCacheCursor::CoinsViewCacheCursor
            (in_stack_fffffffffffffd28,
             (size_t *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             (CoinsCachePair *)in_stack_fffffffffffffd18,
             (CCoinsMap *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             SUB81((ulong)in_stack_fffffffffffffd08 >> 0x38,0));
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
               (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               (unsigned_long)in_stack_fffffffffffffd08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this,file,(size_t)in_stack_fffffffffffffd38,
               (const_string *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    local_168 = 0;
    in_stack_fffffffffffffd38 = in_RDI;
    uint256::uint256((uint256 *)in_stack_fffffffffffffd08);
    in_stack_fffffffffffffd37 =
         (**(code **)(in_stack_fffffffffffffd38->k0 + 0x20))
                   (in_stack_fffffffffffffd38,local_188,&local_168);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
               (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               (unsigned_long)in_stack_fffffffffffffd08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
               (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               (unsigned_long)in_stack_fffffffffffffd08);
    in_stack_fffffffffffffd08 = (PoolResource<144UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_238,local_258,local_278,0x278,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffd08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  ::~unordered_map((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                    *)in_stack_fffffffffffffd08);
  PoolResource<144UL,_8UL>::~PoolResource(in_stack_fffffffffffffd18);
  std::pair<const_COutPoint,_CCoinsCacheEntry>::~pair
            ((pair<const_COutPoint,_CCoinsCacheEntry> *)in_stack_fffffffffffffd08);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteCoinsViewEntry(CCoinsView& view, CAmount value, char flags)
{
    CoinsCachePair sentinel{};
    sentinel.second.SelfRef(sentinel);
    CCoinsMapMemoryResource resource;
    CCoinsMap map{0, CCoinsMap::hasher{}, CCoinsMap::key_equal{}, &resource};
    auto usage{InsertCoinsMapEntry(map, sentinel, value, flags)};
    auto cursor{CoinsViewCacheCursor(usage, sentinel, map, /*will_erase=*/true)};
    BOOST_CHECK(view.BatchWrite(cursor, {}));
}